

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

string * __thiscall
re2::RegexpStatus::Text_abi_cxx11_(string *__return_storage_ptr__,RegexpStatus *this)

{
  RegexpStatusCode in_EDX;
  string local_30;
  
  if ((this->error_arg_).size_ == 0) {
    CodeText_abi_cxx11_(__return_storage_ptr__,(RegexpStatus *)(ulong)this->code_,in_EDX);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    CodeText_abi_cxx11_(&local_30,(RegexpStatus *)(ulong)this->code_,in_EDX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->error_arg_).data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RegexpStatus::Text() const {
  if (error_arg_.empty())
    return CodeText(code_);
  std::string s;
  s.append(CodeText(code_));
  s.append(": ");
  s.append(error_arg_.data(), error_arg_.size());
  return s;
}